

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall
CGameContext::SendVoteStatus(CGameContext *this,int ClientID,int Total,int Yes,int No)

{
  long lVar1;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  CGameContext *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  CNetMsg_Sv_VoteStatus Msg;
  IServer *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (IServer *)CONCAT44(in_R8D,in_ECX);
  Server(in_RDI);
  IServer::SendPackMsg<CNetMsg_Sv_VoteStatus>(this_00,(CNetMsg_Sv_VoteStatus *)in_RDI,in_ESI,in_EDX)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::SendVoteStatus(int ClientID, int Total, int Yes, int No)
{
	CNetMsg_Sv_VoteStatus Msg = {0};
	Msg.m_Total = Total;
	Msg.m_Yes = Yes;
	Msg.m_No = No;
	Msg.m_Pass = Total - (Yes+No);

	Server()->SendPackMsg(&Msg, MSGFLAG_VITAL, ClientID);

}